

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGenerator::ResolveLanguageCompiler
          (cmGlobalGenerator *this,string *lang,cmMakefile *mf,bool optional)

{
  cmState *pcVar1;
  bool bVar2;
  cmValue cVar3;
  string *in_name;
  string_view arg;
  string cnameString;
  string path;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cnameArgVec;
  string changeVars;
  string pathString;
  string langComp;
  allocator<char> local_119;
  string local_118;
  undefined1 local_f8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  undefined1 local_90 [48];
  string local_60;
  string local_40;
  
  local_d8._M_allocated_capacity = (size_type)&DAT_00000006;
  local_d8._8_8_ = (long)"The CMAKE_" + 4;
  local_90._8_8_ = (lang->_M_dataplus)._M_p;
  local_90._0_8_ = lang->_M_string_length;
  cmStrCat<char[10]>(&local_40,(cmAlphaNum *)&local_d8,(cmAlphaNum *)local_90,
                     (char (*) [10])0x5b716a);
  cVar3 = cmMakefile::GetDefinition(mf,&local_40);
  if (cVar3.Value == (string *)0x0) {
    if (optional) goto LAB_001b2a19;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8,
                   &local_40," not set, after EnableLanguage");
    cmSystemTools::Error((string *)&local_d8);
  }
  else {
    in_name = cmMakefile::GetRequiredDefinition(mf,&local_40);
    local_d8._M_allocated_capacity = (size_type)local_c8;
    local_d8._8_8_ = (char *)0x0;
    local_c8[0]._M_local_buf[0] = '\0';
    bVar2 = cmsys::SystemTools::FileIsFullPath(in_name);
    if (bVar2) {
      std::__cxx11::string::_M_assign((string *)local_d8._M_local_buf);
    }
    else {
      local_f8._0_8_ = (pointer)0x0;
      local_f8._8_8_ = (pointer)0x0;
      local_f8._16_8_ = (pointer)0x0;
      cmsys::SystemTools::FindProgram
                ((string *)local_90,in_name,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_f8,false);
      std::__cxx11::string::operator=((string *)local_d8._M_local_buf,(string *)local_90);
      std::__cxx11::string::~string((string *)local_90);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_f8);
    }
    if (optional) {
LAB_001b27ca:
      cVar3 = cmState::GetInitializedCacheValue
                        ((this->CMakeInstance->State)._M_t.
                         super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                         super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                         super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&local_40);
      local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (cVar3.Value == (string *)0x0) {
        cVar3.Value = (string *)0x0;
      }
      else if ((cVar3.Value)->_M_string_length != 0) {
        arg._M_str = ((cVar3.Value)->_M_dataplus)._M_p;
        arg._M_len = (cVar3.Value)->_M_string_length;
        cmExpandList(arg,&local_a8,false);
        cVar3.Value = local_a8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
      }
      local_90._0_8_ = local_90 + 0x10;
      local_90._8_8_ = (pointer)0x0;
      local_90[0x10] = '\0';
      if (cVar3.Value != (string *)0x0 && !optional) {
        local_f8._0_8_ = local_f8 + 0x10;
        local_f8._8_8_ = (pointer)0x0;
        local_f8._16_8_ = local_f8._16_8_ & 0xffffffffffffff00;
        bVar2 = cmsys::SystemTools::FileIsFullPath(cVar3.Value);
        if (bVar2) {
          std::__cxx11::string::_M_assign((string *)local_f8);
        }
        else {
          local_118._M_dataplus._M_p = (pointer)0x0;
          local_118._M_string_length = 0;
          local_118.field_2._M_allocated_capacity = 0;
          cmsys::SystemTools::FindProgram
                    (&local_60,cVar3.Value,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_118,false);
          std::__cxx11::string::operator=((string *)local_f8,(string *)&local_60);
          std::__cxx11::string::~string((string *)&local_60);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_118);
        }
        std::__cxx11::string::string((string *)&local_60,(string *)local_d8._M_local_buf);
        cmsys::SystemTools::ConvertToUnixSlashes((string *)local_f8);
        cmsys::SystemTools::ConvertToUnixSlashes(&local_60);
        bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_f8,&local_60);
        if (bVar2) {
          pcVar1 = (this->CMakeInstance->State)._M_t.
                   super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                   super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                   super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_118,"__CMAKE_DELETE_CACHE_CHANGE_VARS_",&local_119);
          cVar3 = cmState::GetGlobalProperty(pcVar1,&local_118);
          std::__cxx11::string::~string((string *)&local_118);
          if (cVar3.Value != (string *)0x0) {
            std::__cxx11::string::append((string *)local_90);
            std::__cxx11::string::append(local_90);
          }
          std::__cxx11::string::append((string *)local_90);
          std::__cxx11::string::append(local_90);
          std::__cxx11::string::append((string *)local_90);
          pcVar1 = (this->CMakeInstance->State)._M_t.
                   super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                   super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                   super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_118,"__CMAKE_DELETE_CACHE_CHANGE_VARS_",&local_119);
          cmState::SetGlobalProperty(pcVar1,&local_118,(char *)local_90._0_8_);
          std::__cxx11::string::~string((string *)&local_118);
        }
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::~string((string *)local_f8);
      }
      std::__cxx11::string::~string((string *)local_90);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_a8);
    }
    else if ((char *)local_d8._8_8_ != (char *)0x0) {
      bVar2 = cmsys::SystemTools::FileExists((string *)&local_d8);
      if (bVar2) goto LAB_001b27ca;
    }
  }
  std::__cxx11::string::~string((string *)local_d8._M_local_buf);
LAB_001b2a19:
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void cmGlobalGenerator::ResolveLanguageCompiler(const std::string& lang,
                                                cmMakefile* mf,
                                                bool optional) const
{
  std::string langComp = cmStrCat("CMAKE_", lang, "_COMPILER");

  if (!mf->GetDefinition(langComp)) {
    if (!optional) {
      cmSystemTools::Error(langComp + " not set, after EnableLanguage");
    }
    return;
  }
  std::string const& name = mf->GetRequiredDefinition(langComp);
  std::string path;
  if (!cmSystemTools::FileIsFullPath(name)) {
    path = cmSystemTools::FindProgram(name);
  } else {
    path = name;
  }
  if (!optional && (path.empty() || !cmSystemTools::FileExists(path))) {
    return;
  }
  cmValue cname =
    this->GetCMakeInstance()->GetState()->GetInitializedCacheValue(langComp);

  // Split compiler from arguments
  std::vector<std::string> cnameArgVec;
  if (cname && !cname->empty()) {
    cmExpandList(*cname, cnameArgVec);
    cname = cmValue(cnameArgVec.front());
  }

  std::string changeVars;
  if (cname && !optional) {
    std::string cnameString;
    if (!cmSystemTools::FileIsFullPath(*cname)) {
      cnameString = cmSystemTools::FindProgram(*cname);
    } else {
      cnameString = *cname;
    }
    std::string pathString = path;
    // get rid of potentially multiple slashes:
    cmSystemTools::ConvertToUnixSlashes(cnameString);
    cmSystemTools::ConvertToUnixSlashes(pathString);
    if (cnameString != pathString) {
      cmValue cvars = this->GetCMakeInstance()->GetState()->GetGlobalProperty(
        "__CMAKE_DELETE_CACHE_CHANGE_VARS_");
      if (cvars) {
        changeVars += *cvars;
        changeVars += ";";
      }
      changeVars += langComp;
      changeVars += ";";
      changeVars += *cname;
      this->GetCMakeInstance()->GetState()->SetGlobalProperty(
        "__CMAKE_DELETE_CACHE_CHANGE_VARS_", changeVars.c_str());
    }
  }
}